

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O0

void __thiscall
TPZEigenAnalysis::TPZEigenAnalysis
          (TPZEigenAnalysis *this,TPZAutoPointer<TPZCompMesh> *mesh,bool mustOptimizeBandwidth,
          ostream *out)

{
  TPZFMatrix<std::complex<double>_> *in_RCX;
  undefined8 *in_RDI;
  int64_t in_stack_00000008;
  TPZManVector<std::complex<double>,_10> *in_stack_00000010;
  ostream *in_stack_000000e0;
  bool in_stack_000000ef;
  TPZAutoPointer<TPZCompMesh> *in_stack_000000f0;
  void **in_stack_000000f8;
  TPZAnalysis *in_stack_00000100;
  TPZAutoPointer<TPZCompMesh> *in_stack_ffffffffffffffa8;
  TPZAutoPointer<TPZCompMesh> *in_stack_ffffffffffffffb0;
  
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  TPZAnalysis::TPZAnalysis
            (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000ef,
             in_stack_000000e0);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__TPZEigenAnalysis_0252c740;
  TPZManVector<std::complex<double>,_10>::TPZManVector(in_stack_00000010,in_stack_00000008);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(in_RCX);
  *(undefined1 *)(in_RDI + 0x93) = 1;
  return;
}

Assistant:

TPZEigenAnalysis::TPZEigenAnalysis(TPZAutoPointer<TPZCompMesh> mesh,
                                   bool mustOptimizeBandwidth,
                                   std::ostream &out)
  : TPZAnalysis(mesh, mustOptimizeBandwidth, out)
{

}